

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2DeepRecursion(void)

{
  bool bVar1;
  string comment;
  string a;
  RE2 re;
  LogMessageFatal local_188;
  
  std::__cxx11::string::string((string *)&comment,"x*",(allocator *)&local_188);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::string::_M_construct((ulong)&a,'\0');
  std::__cxx11::string::append((string *)&comment);
  std::__cxx11::string::append((char *)&comment);
  RE2::RE2(&re,"((?:\\s|xx.*\n|x[*](?:\n|.)*?[*]x)*)");
  local_188.super_LogMessage._0_8_ = comment._M_dataplus._M_p;
  local_188.super_LogMessage._8_4_ = (int)comment._M_string_length;
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_188,&re);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4c4);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(comment, re)");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  RE2::~RE2(&re);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&comment);
  return;
}

Assistant:

TEST(RE2, DeepRecursion) {
  // Test for deep stack recursion.  This would fail with a
  // segmentation violation due to stack overflow before pcre was
  // patched.
  // Again, a PCRE legacy test.  RE2 doesn't recurse.
  string comment("x*");
  string a(131072, 'a');
  comment += a;
  comment += "*x";
  RE2 re("((?:\\s|xx.*\n|x[*](?:\n|.)*?[*]x)*)");
  CHECK(RE2::FullMatch(comment, re));
}